

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int whereClauseInsert(WhereClause *pWC,Expr *p,u16 wtFlags)

{
  LogEst LVar1;
  int iVar2;
  void *pvVar3;
  undefined8 *puVar4;
  Expr *pEVar5;
  ushort in_DX;
  Expr *in_RSI;
  undefined8 *in_RDI;
  sqlite3 *db;
  WhereTerm *pOld;
  int idx;
  WhereTerm *pTerm;
  sqlite3 *in_stack_ffffffffffffffb8;
  sqlite3 *db_00;
  sqlite3 *db_01;
  
  if (*(int *)(in_RDI + 3) <= *(int *)((long)in_RDI + 0x14)) {
    db_01 = (sqlite3 *)in_RDI[4];
    db_00 = (sqlite3 *)**(u64 **)*in_RDI;
    pvVar3 = sqlite3DbMallocRawNN(db_01,(u64)db_00);
    in_RDI[4] = pvVar3;
    if (in_RDI[4] == 0) {
      if ((in_DX & 1) != 0) {
        sqlite3ExprDelete(db_00,(Expr *)in_stack_ffffffffffffffb8);
      }
      in_RDI[4] = db_01;
      return 0;
    }
    memcpy((void *)in_RDI[4],db_01,(long)*(int *)((long)in_RDI + 0x14) << 6);
    if (db_01 != (sqlite3 *)(in_RDI + 5)) {
      sqlite3DbFree(db_00,in_stack_ffffffffffffffb8);
    }
    iVar2 = sqlite3DbMallocSize(in_stack_ffffffffffffffb8,(void *)0x1c02fb);
    *(int *)(in_RDI + 3) = (int)((ulong)(long)iVar2 >> 6);
  }
  iVar2 = *(int *)((long)in_RDI + 0x14);
  *(int *)((long)in_RDI + 0x14) = iVar2 + 1;
  puVar4 = (undefined8 *)(in_RDI[4] + (long)iVar2 * 0x40);
  if ((in_RSI == (Expr *)0x0) || ((in_RSI->flags & 0x40000) == 0)) {
    *(undefined2 *)(puVar4 + 2) = 1;
  }
  else {
    LVar1 = sqlite3LogEst((long)in_RSI->iTable);
    *(LogEst *)(puVar4 + 2) = LVar1 + -0x10e;
  }
  pEVar5 = sqlite3ExprSkipCollate(in_RSI);
  *puVar4 = pEVar5;
  *(ushort *)((long)puVar4 + 0x12) = in_DX;
  puVar4[1] = in_RDI;
  *(undefined4 *)(puVar4 + 3) = 0xffffffff;
  memset((void *)((long)puVar4 + 0x14),0,0x2c);
  return iVar2;
}

Assistant:

static int whereClauseInsert(WhereClause *pWC, Expr *p, u16 wtFlags){
  WhereTerm *pTerm;
  int idx;
  testcase( wtFlags & TERM_VIRTUAL );
  if( pWC->nTerm>=pWC->nSlot ){
    WhereTerm *pOld = pWC->a;
    sqlite3 *db = pWC->pWInfo->pParse->db;
    pWC->a = sqlite3DbMallocRawNN(db, sizeof(pWC->a[0])*pWC->nSlot*2 );
    if( pWC->a==0 ){
      if( wtFlags & TERM_DYNAMIC ){
        sqlite3ExprDelete(db, p);
      }
      pWC->a = pOld;
      return 0;
    }
    memcpy(pWC->a, pOld, sizeof(pWC->a[0])*pWC->nTerm);
    if( pOld!=pWC->aStatic ){
      sqlite3DbFree(db, pOld);
    }
    pWC->nSlot = sqlite3DbMallocSize(db, pWC->a)/sizeof(pWC->a[0]);
  }
  pTerm = &pWC->a[idx = pWC->nTerm++];
  if( p && ExprHasProperty(p, EP_Unlikely) ){
    pTerm->truthProb = sqlite3LogEst(p->iTable) - 270;
  }else{
    pTerm->truthProb = 1;
  }
  pTerm->pExpr = sqlite3ExprSkipCollate(p);
  pTerm->wtFlags = wtFlags;
  pTerm->pWC = pWC;
  pTerm->iParent = -1;
  memset(&pTerm->eOperator, 0,
         sizeof(WhereTerm) - offsetof(WhereTerm,eOperator));
  return idx;
}